

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O0

void __thiscall GdlSubstitutionItem::~GdlSubstitutionItem(GdlSubstitutionItem *this)

{
  GdlSetAttrItem *pGVar1;
  reference ppGVar2;
  undefined8 *in_RDI;
  size_t i;
  GdlSetAttrItem *this_00;
  GdlSetAttrItem *local_10;
  
  *in_RDI = &PTR_Clone_0036b980;
  local_10 = (GdlSetAttrItem *)0x0;
  while (this_00 = local_10,
        pGVar1 = (GdlSetAttrItem *)
                 std::vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>::size
                           ((vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                             *)(in_RDI + 0x15)), this_00 < pGVar1) {
    ppGVar2 = std::vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>::
              operator[]((vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_> *)
                         (in_RDI + 0x15),(size_type_conflict)local_10);
    if (*ppGVar2 != (value_type)0x0) {
      (**(code **)(*(long *)*ppGVar2 + 0x10))();
    }
    local_10 = (GdlSetAttrItem *)
               ((long)&(((_Vector_impl *)&(local_10->super_GdlRuleItem)._vptr_GdlRuleItem)->
                       super__Vector_impl_data)._M_start + 1);
  }
  if ((in_RDI[0x14] != 0) && ((long *)in_RDI[0x14] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[0x14] + 0x10))();
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>::~vector
            ((vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_> *)this_00);
  GdlSetAttrItem::~GdlSetAttrItem(this_00);
  return;
}

Assistant:

virtual ~GdlSubstitutionItem()
	{
		for (size_t i = 0; i < m_vpexpAssocs.size(); ++i)
			delete m_vpexpAssocs[i];

		if (m_pexpSelector)
			delete m_pexpSelector;
	}